

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O3

void Handlers::Init_Init(EOClient *client,PacketReader *reader)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  World *pWVar3;
  byte bVar4;
  uchar uVar5;
  bool bVar6;
  bool bVar7;
  pair<unsigned_char,_unsigned_char> pVar8;
  uint uVar9;
  uint uVar10;
  IPAddress IVar11;
  int iVar12;
  int iVar13;
  mapped_type *pmVar14;
  time_t tVar15;
  _List_node_base *p_Var16;
  EOClient *pEVar17;
  int iVar18;
  EOServer *pEVar19;
  int *hdid;
  double dVar20;
  IPAddress remote_addr;
  char errbuf [64];
  PacketBuilder reply;
  string hdid_str;
  IPAddress local_d4;
  EOClient *local_d0;
  key_type local_c8 [2];
  PacketBuilder local_88;
  ulong local_58;
  string local_50;
  
  PacketBuilder::PacketBuilder(&local_88,PACKET_F_INIT,PACKET_A_INIT,10);
  uVar9 = PacketReader::GetThree(reader);
  PacketReader::GetChar(reader);
  PacketReader::GetChar(reader);
  bVar4 = PacketReader::GetChar(reader);
  client->version = (uint)bVar4;
  uVar5 = PacketReader::GetChar(reader);
  bVar4 = PacketReader::GetChar(reader);
  PacketReader::GetEndString_abi_cxx11_(&local_50,reader);
  uVar10 = util::to_uint_raw(&local_50);
  client->hdid = uVar10;
  pEVar19 = (EOServer *)(client->super_Client).server;
  if (local_50._M_string_length == bVar4) {
    plVar1 = &(pEVar19->super_Server).clients;
    p_Var16 = (pEVar19->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    iVar18 = 0;
    local_d0 = client;
    local_58 = (ulong)uVar9;
    if (p_Var16 != (_List_node_base *)plVar1) {
      do {
        if (*(int *)&((Client *)p_Var16[1]._M_next)[1].send_buffer.field_2 == client->hdid) {
          IVar11 = Client::GetRemoteAddr((Client *)p_Var16[1]._M_next);
          local_c8[0]._M_dataplus._M_p._0_4_ = IVar11.address;
          local_d4 = Client::GetRemoteAddr(&local_d0->super_Client);
          bVar6 = IPAddress::operator==((IPAddress *)local_c8,&local_d4);
          iVar18 = iVar18 + (uint)bVar6;
        }
        p_Var16 = p_Var16->_M_next;
      } while (p_Var16 != (_List_node_base *)plVar1);
      pEVar19 = (EOServer *)(local_d0->super_Client).server;
    }
    pEVar17 = local_d0;
    pWVar3 = pEVar19->world;
    paVar2 = &local_c8[0].field_2;
    local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"IgnoreHDID","");
    pmVar14 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,local_c8);
    bVar6 = util::variant::GetBool(pmVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) {
      p_Var16 = (pEVar17->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MaxConnectionsPerPC","");
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var16[0x19]._M_prev,local_c8);
      iVar12 = util::variant::GetInt(pmVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if ((iVar12 != 0) && (iVar12 < iVar18)) {
        snprintf((char *)local_c8,0x40,"too many connections from this PC: %08x",
                 (ulong)(uint)pEVar17->hdid);
        pEVar19 = (EOServer *)(pEVar17->super_Client).server;
        local_d4 = Client::GetRemoteAddr(&pEVar17->super_Client);
        EOServer::RecordClientRejection(pEVar19,&local_d4,(char *)local_c8);
        Client::Close(&pEVar17->super_Client,true);
        goto LAB_0015ecb8;
      }
    }
    local_d4 = Client::GetRemoteAddr(&pEVar17->super_Client);
    hdid = &client->hdid;
    if (bVar6) {
      hdid = (int *)0x0;
    }
    iVar18 = World::CheckBan((World *)(pEVar17->super_Client).server[1].clients.
                                      super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                      _M_node.super__List_node_base._M_prev,(string *)0x0,&local_d4,
                             hdid);
    if (iVar18 == -1) {
      p_Var16 = (pEVar17->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MinVersion","");
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var16[0x19]._M_prev,local_c8);
      iVar18 = util::variant::GetInt(pmVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if (iVar18 == 0) {
        p_Var16 = (pEVar17->super_Client).server[1].clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_prev;
        local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"OldVersionCompat","");
        pmVar14 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var16[0x19]._M_prev,local_c8);
        bVar6 = util::variant::GetBool(pmVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1
                         );
        }
        iVar18 = 0x1c - (uint)bVar6;
        pEVar17 = local_d0;
      }
      p_Var16 = (pEVar17->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MaxVersion","");
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var16[0x19]._M_prev,local_c8);
      iVar12 = util::variant::GetInt(pmVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if (pEVar17->version < iVar18) {
        bVar6 = false;
      }
      else {
        iVar13 = 0x1c;
        if (iVar12 != 0) {
          iVar13 = iVar12;
        }
        bVar6 = pEVar17->version <= iVar13 || iVar13 < 0;
      }
      p_Var16 = (local_d0->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CheckVersion","");
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var16[0x19]._M_prev,local_c8);
      bVar7 = util::variant::GetBool(pmVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      pEVar17 = local_d0;
      if ((bVar7 & (bVar6 ^ 1U | uVar5 != 'p')) == 0) {
        iVar18 = (int)local_58;
        uVar9 = iVar18 + 1;
        iVar12 = util::rand();
        iVar13 = util::rand();
        EOClient::InitNewSequence(pEVar17);
        pVar8 = EOClient::GetSeqInitBytes(pEVar17);
        PacketBuilder::AddByte(&local_88,'\x02');
        PacketBuilder::AddByte(&local_88,pVar8.first);
        PacketBuilder::AddByte(&local_88,pVar8.second);
        PacketBuilder::AddByte(&local_88,(uchar)iVar12);
        PacketBuilder::AddByte(&local_88,(uchar)iVar13);
        PacketBuilder::AddShort(&local_88,pEVar17->id);
        PacketBuilder::AddThree
                  (&local_88,
                   ((0xa94023U - iVar18) %
                   (((iVar18 - (uVar9 / 0xb + (uVar9 / 0xb) * 10)) + 1) * 0x77 + 0x77)) *
                   (((uVar9 / 9) * -9 + (int)local_58 + 1) * 0x77 + 0x77) +
                   (uVar9 / 0x7d4) * -0x7d4 + (int)local_58 + 0x1b13a);
        PacketProcessor::SetEMulti(&pEVar17->processor,(uchar)iVar12,(uchar)iVar13);
        EOClient::Send(pEVar17,&local_88);
        pEVar17->state = Initialized;
      }
      else {
        pEVar19 = (EOServer *)(local_d0->super_Client).server;
        IVar11 = Client::GetRemoteAddr(&local_d0->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar11.address;
        EOServer::RecordClientRejection(pEVar19,(IPAddress *)local_c8,"out of date");
        PacketBuilder::AddByte(&local_88,'\x01');
        PacketBuilder::AddChar(&local_88,0);
        PacketBuilder::AddChar(&local_88,0);
        PacketBuilder::AddChar(&local_88,iVar18);
        EOClient::Send(pEVar17,&local_88);
        Client::Close(&pEVar17->super_Client,false);
      }
    }
    else {
      PacketBuilder::AddByte(&local_88,'\x03');
      pEVar19 = (EOServer *)(pEVar17->super_Client).server;
      if (iVar18 == 0) {
        IVar11 = Client::GetRemoteAddr(&pEVar17->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar11.address;
        EOServer::RecordClientRejection(pEVar19,(IPAddress *)local_c8,"perm ban");
        PacketBuilder::AddByte(&local_88,'\x02');
      }
      else {
        IVar11 = Client::GetRemoteAddr(&pEVar17->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar11.address;
        EOServer::RecordClientRejection(pEVar19,(IPAddress *)local_c8,"temp ban");
        tVar15 = time((time_t *)0x0);
        PacketBuilder::AddByte(&local_88,'\0');
        dVar20 = ceil((double)(iVar18 - tVar15) / 60.0);
        if (255.0 <= dVar20) {
          dVar20 = 255.0;
        }
        PacketBuilder::AddByte(&local_88,(uchar)(int)dVar20);
      }
      EOClient::Send(pEVar17,&local_88);
      Client::Close(&pEVar17->super_Client,false);
    }
  }
  else {
    IVar11 = Client::GetRemoteAddr(&client->super_Client);
    local_c8[0]._M_dataplus._M_p._0_4_ = IVar11.address;
    EOServer::RecordClientRejection(pEVar19,(IPAddress *)local_c8,"bad hdid");
    Client::Close(&client->super_Client,true);
  }
LAB_0015ecb8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::~PacketBuilder(&local_88);
  return;
}

Assistant:

void Init_Init(EOClient *client, PacketReader &reader)
{
	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 10);

	unsigned int challenge;
	unsigned int response;

	challenge = reader.GetThree();

	reader.GetChar(); // ?
	reader.GetChar(); // ?
	client->version = reader.GetChar();
	unsigned prot = reader.GetChar();
	unsigned hdid_len = reader.GetChar();
	std::string hdid_str = reader.GetEndString();

	try
	{
		client->hdid = int(util::to_uint_raw(hdid_str));
	}
	catch (std::invalid_argument&)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	if (hdid_str.length() != hdid_len)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	int pc_connections = 0;

	UTIL_FOREACH(client->server()->clients, checkclient)
	{
		EOClient *checkeoclient = static_cast<EOClient *>(checkclient);

		if (checkeoclient->hdid == client->hdid && checkeoclient->GetRemoteAddr() == client->GetRemoteAddr())
		{
			++pc_connections;
		}
	}

	const bool ignore_hdid = client->server()->world->config["IgnoreHDID"];

	if (!ignore_hdid)
	{
		const int max_per_pc = int(client->server()->world->config["MaxConnectionsPerPC"]);

		if (max_per_pc != 0 && pc_connections > max_per_pc)
		{
			char errbuf[64];
			std::snprintf(errbuf, sizeof errbuf, "too many connections from this PC: %08x", client->hdid);
			client->server()->RecordClientRejection(client->GetRemoteAddr(), errbuf);
			client->Close(true);
			return;
		}
	}

	int ban_expires;
	IPAddress remote_addr = client->GetRemoteAddr();
	if ((ban_expires = client->server()->world->CheckBan(0, &remote_addr, ignore_hdid ? 0 : &client->hdid)) != -1)
	{
		reply.AddByte(INIT_BANNED);
		if (ban_expires == 0)
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "perm ban");
			reply.AddByte(INIT_BAN_PERM);
		}
		else
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "temp ban");
			int mins_remaining = int(std::min(255.0, std::ceil(double(ban_expires - std::time(0)) / 60.0)));
			reply.AddByte(INIT_BAN_TEMP);
			reply.AddByte(mins_remaining);
		}
		client->Send(reply);
		client->Close();
		return;
	}

	int minversion = client->server()->world->config["MinVersion"];
	if (!minversion)
	{
		minversion = client->server()->world->config["OldVersionCompat"] ? 27 : 28;
	}

	int maxversion = client->server()->world->config["MaxVersion"];
	if (!maxversion)
	{
		maxversion = 28;
	}

	bool accepted_version = client->version >= minversion && (maxversion < 0 || client->version <= maxversion);

	if (prot != 112)
		accepted_version = false;

	if (client->server()->world->config["CheckVersion"] && !accepted_version)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "out of date");
		reply.AddByte(INIT_OUT_OF_DATE);
		reply.AddChar(0);
		reply.AddChar(0);
		reply.AddChar(minversion);
		client->Send(reply);
		client->Close();
		return;
	}

	response = stupid_hash(challenge);

	int emulti_e = util::rand(6,12);
	int emulti_d = util::rand(6,12);

	client->InitNewSequence();
	auto seq_bytes = client->GetSeqInitBytes();

	reply.AddByte(INIT_OK);
	reply.AddByte(seq_bytes.first);
	reply.AddByte(seq_bytes.second);
	reply.AddByte(emulti_e);
	reply.AddByte(emulti_d);
	reply.AddShort(client->id);
	reply.AddThree(response);

	client->processor.SetEMulti(emulti_e, emulti_d);

	client->Send(reply);

	client->state = EOClient::Initialized;

	return;
}